

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O0

void __thiscall
GF2::Buchb<45UL,_GF2::MOGrlex<45UL>,_GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>_>::Init
          (Buchb<45UL,_GF2::MOGrlex<45UL>,_GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>_> *this)

{
  MOGrlex<45UL> *in_RDI;
  MI<45UL,_GF2::MOGrlex<45UL>_> *unaff_retaddr;
  list<GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>_>_>
  *in_stack_fffffffffffffff0;
  MOGrlex<45UL> *oRight;
  
  oRight = in_RDI;
  MI<45UL,_GF2::MOGrlex<45UL>_>::SetEmpty((MI<45UL,_GF2::MOGrlex<45UL>_> *)0x19206b);
  MI<45UL,_GF2::MOGrlex<45UL>_>::SetEmpty((MI<45UL,_GF2::MOGrlex<45UL>_> *)0x192078);
  MI<45UL,_GF2::MOGrlex<45UL>_>::SetOrder(unaff_retaddr,oRight);
  MI<45UL,_GF2::MOGrlex<45UL>_>::SetOrder(unaff_retaddr,oRight);
  std::__cxx11::
  list<GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ::clear(in_stack_fffffffffffffff0);
  std::__cxx11::
  list<GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>_>_>
  ::clear(in_stack_fffffffffffffff0);
  memset(in_RDI + 0x78,0,0x40);
  return;
}

Assistant:

void Init()
	{
		// очищаем списки многочленов
		_basis.SetEmpty(); _reserve.SetEmpty();
		// устанавливаем порядок по умолчанию
		_basis.SetOrder(_O());
		_reserve.SetOrder(_O());
		// готовим списки пар
		_pairs.clear();
		_pairs_processed.clear();
		// обнуляем статистику
		std::memset(&_stat, 0, sizeof(_stat));
	}